

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_string.h
# Opt level: O0

ST_ssize_t __thiscall
ST::string::_find_last(string *this,size_t max,char *substr,size_t count,case_sensitivity_t cs)

{
  char *pcVar1;
  size_t sVar2;
  long local_88;
  char *local_80;
  size_t local_70;
  char *cp;
  char *found;
  char *start;
  char *endp;
  case_sensitivity_t cs_local;
  size_t count_local;
  char *substr_local;
  size_t max_local;
  string *this_local;
  
  pcVar1 = c_str(this);
  sVar2 = size(this);
  local_70 = max;
  if (sVar2 < max) {
    local_70 = size(this);
  }
  pcVar1 = pcVar1 + local_70;
  found = c_str(this);
  cp = (char *)0x0;
  while( true ) {
    if (cs == case_sensitive) {
      local_80 = _ST_PRIVATE::find_cs(found,(long)pcVar1 - (long)found,substr,count);
    }
    else {
      local_80 = _ST_PRIVATE::find_ci(found,(long)pcVar1 - (long)found,substr,count);
    }
    if ((local_80 == (char *)0x0) || (pcVar1 <= local_80)) break;
    cp = local_80;
    found = local_80 + 1;
  }
  if (cp == (char *)0x0) {
    local_88 = -1;
  }
  else {
    pcVar1 = c_str(this);
    local_88 = (long)cp - (long)pcVar1;
  }
  return local_88;
}

Assistant:

ST_NODISCARD
        ST_ssize_t _find_last(size_t max, const char *substr, size_t count,
                              case_sensitivity_t cs = case_sensitive) const noexcept
        {
            const char *endp = c_str() + (max > size() ? size() : max);

            const char *start = c_str();
            const char *found = nullptr;
            for ( ;; ) {
                const char *cp = (cs == case_sensitive)
                        ? _ST_PRIVATE::find_cs(start, endp - start, substr, count)
                        : _ST_PRIVATE::find_ci(start, endp - start, substr, count);
                if (!cp || cp >= endp)
                    break;
                found = cp;
                start = cp + 1;
            }
            return found ? (found - c_str()) : -1;
        }